

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O0

void GlueFreeBlocks(CPpmd7 *p)

{
  byte bVar1;
  uint uVar2;
  Byte *pBVar3;
  uint uVar4;
  uint *puVar5;
  short *psVar6;
  CPpmd7 *in_RDI;
  uint k;
  CPpmd7_Node_Ref next_1;
  uint nu_2;
  CPpmd7_Node *node_2;
  CPpmd7_Node *node2;
  UInt32 nu_1;
  CPpmd7_Node *node_1;
  CPpmd7_Node *node;
  CPpmd7_Node_Ref next;
  UInt16 nu;
  uint i;
  CPpmd7_Node_Ref n;
  CPpmd7_Node_Ref head;
  uint local_4c;
  Byte *local_48;
  uint local_34;
  uint local_1c;
  uint local_14;
  uint local_10;
  
  uVar4 = in_RDI->AlignOffset + in_RDI->Size;
  in_RDI->GlueCount = 0xff;
  local_10 = uVar4;
  for (local_14 = 0; local_14 < 0x26; local_14 = local_14 + 1) {
    bVar1 = in_RDI->Indx2Units[local_14];
    local_1c = in_RDI->FreeList[local_14];
    in_RDI->FreeList[local_14] = 0;
    while (local_1c != 0) {
      puVar5 = (uint *)(in_RDI->Base + local_1c);
      puVar5[1] = local_10;
      uVar2 = local_1c;
      *(uint *)(in_RDI->Base + (ulong)local_10 + 8) = local_1c;
      local_1c = *puVar5;
      *(undefined2 *)puVar5 = 0;
      *(ushort *)((long)puVar5 + 2) = (ushort)bVar1;
      local_10 = uVar2;
    }
  }
  pBVar3 = in_RDI->Base;
  (pBVar3 + uVar4)[0] = '\x01';
  (pBVar3 + uVar4)[1] = '\0';
  *(uint *)(in_RDI->Base + (ulong)uVar4 + 4) = local_10;
  *(uint *)(in_RDI->Base + (ulong)local_10 + 8) = uVar4;
  if (in_RDI->LoUnit != in_RDI->HiUnit) {
    pBVar3 = in_RDI->LoUnit;
    pBVar3[0] = '\x01';
    pBVar3[1] = '\0';
  }
  for (; local_10 != uVar4; local_10 = *(uint *)(pBVar3 + (ulong)local_10 + 4)) {
    pBVar3 = in_RDI->Base;
    local_34 = (uint)*(ushort *)(pBVar3 + (ulong)local_10 + 2);
    while( true ) {
      psVar6 = (short *)(in_RDI->Base + (ulong)local_34 * 0xc + (ulong)local_10);
      local_34 = (ushort)psVar6[1] + local_34;
      if ((*psVar6 != 0) || (0xffff < local_34)) break;
      *(undefined4 *)(in_RDI->Base + (ulong)*(uint *)(psVar6 + 4) + 4) = *(undefined4 *)(psVar6 + 2)
      ;
      *(undefined4 *)(in_RDI->Base + (ulong)*(uint *)(psVar6 + 2) + 8) = *(undefined4 *)(psVar6 + 4)
      ;
      *(short *)(pBVar3 + (ulong)local_10 + 2) = (short)local_34;
    }
  }
  local_10 = *(uint *)(in_RDI->Base + (ulong)uVar4 + 4);
  while (local_10 != uVar4) {
    local_48 = in_RDI->Base + local_10;
    local_10 = *(uint *)(local_48 + 4);
    for (local_4c = (uint)*(ushort *)(local_48 + 2); 0x80 < local_4c; local_4c = local_4c - 0x80) {
      InsertNode(in_RDI,local_48,0x25);
      local_48 = local_48 + 0x600;
    }
    local_14 = (uint)in_RDI->Units2Indx[local_4c - 1];
    if (in_RDI->Indx2Units[local_14] != local_4c) {
      local_14 = local_14 - 1;
      InsertNode(in_RDI,local_48 + (ulong)(uint)in_RDI->Indx2Units[local_14] * 0xc,
                 (local_4c - in_RDI->Indx2Units[local_14]) - 1);
    }
    InsertNode(in_RDI,local_48,local_14);
  }
  return;
}

Assistant:

static void GlueFreeBlocks(CPpmd7 *p)
{
  #ifdef PPMD_32BIT
  CPpmd7_Node headItem;
  CPpmd7_Node_Ref head = &headItem;
  #else
  CPpmd7_Node_Ref head = p->AlignOffset + p->Size;
  #endif
  
  CPpmd7_Node_Ref n = head;
  unsigned i;

  p->GlueCount = 255;

  /* create doubly-linked list of free blocks */
  for (i = 0; i < PPMD_NUM_INDEXES; i++)
  {
    UInt16 nu = I2U(i);
    CPpmd7_Node_Ref next = (CPpmd7_Node_Ref)p->FreeList[i];
    p->FreeList[i] = 0;
    while (next != 0)
    {
      CPpmd7_Node *node = NODE(next);
      node->Next = n;
      n = NODE(n)->Prev = next;
      next = *(const CPpmd7_Node_Ref *)node;
      node->Stamp = 0;
      node->NU = (UInt16)nu;
    }
  }
  NODE(head)->Stamp = 1;
  NODE(head)->Next = n;
  NODE(n)->Prev = head;
  if (p->LoUnit != p->HiUnit)
    ((CPpmd7_Node *)p->LoUnit)->Stamp = 1;
  
  /* Glue free blocks */
  while (n != head)
  {
    CPpmd7_Node *node = NODE(n);
    UInt32 nu = (UInt32)node->NU;
    for (;;)
    {
      CPpmd7_Node *node2 = NODE(n) + nu;
      nu += node2->NU;
      if (node2->Stamp != 0 || nu >= 0x10000)
        break;
      NODE(node2->Prev)->Next = node2->Next;
      NODE(node2->Next)->Prev = node2->Prev;
      node->NU = (UInt16)nu;
    }
    n = node->Next;
  }
  
  /* Fill lists of free blocks */
  for (n = NODE(head)->Next; n != head;)
  {
    CPpmd7_Node *node = NODE(n);
    unsigned nu;
    CPpmd7_Node_Ref next = node->Next;
    for (nu = node->NU; nu > 128; nu -= 128, node += 128)
      InsertNode(p, node, PPMD_NUM_INDEXES - 1);
    if (I2U(i = U2I(nu)) != nu)
    {
      unsigned k = I2U(--i);
      InsertNode(p, node + k, nu - k - 1);
    }
    InsertNode(p, node, i);
    n = next;
  }
}